

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
* ylt::metric::manager_helper::
  filter_metrics_by_name<std::vector<std::shared_ptr<ylt::metric::metric_t>,std::allocator<std::shared_ptr<ylt::metric::metric_t>>>>
            (vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
             *metrics,regex *name_regex)

{
  bool bVar1;
  element_type *this;
  string *__re;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<ylt::metric::metric_t> *m;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  *__range3;
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  *filtered_metrics;
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  match_flag_type in_stack_ffffffffffffff94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  __normal_iterator<std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_10;
  
  local_19 = 0;
  __s = in_RDI;
  local_10 = in_RSI;
  std::
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ::vector((vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
            *)0x1ed84a);
  local_28 = local_10;
  local_30._M_current =
       (shared_ptr<ylt::metric::metric_t> *)
       std::
       vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
       ::begin(in_stack_ffffffffffffff88);
  std::
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
                           ((__normal_iterator<std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (__normal_iterator<std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
                             *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
    ::operator*(&local_30);
    this = std::__shared_ptr_access<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ed8a5);
    __re = metric_t::str_name_abi_cxx11_(this);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (__s,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)__re,
                       in_stack_ffffffffffffff94);
    in_stack_ffffffffffffff94 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
    if (bVar1) {
      std::
      vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
      ::push_back((vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
                   *)__s,(value_type *)__re);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
    ::operator++(&local_30);
  }
  return (vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
          *)in_RDI;
}

Assistant:

static std::vector<std::shared_ptr<metric_t>> filter_metrics_by_name(
      auto& metrics, const std::regex& name_regex) {
    std::vector<std::shared_ptr<metric_t>> filtered_metrics;
    for (auto& m : metrics) {
      if (std::regex_match(m->str_name(), name_regex)) {
        filtered_metrics.push_back(m);
      }
    }
    return filtered_metrics;
  }